

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

NFSubstitution *
icu_63::NFSubstitution::makeSubstitution
          (int32_t pos,NFRule *rule,NFRule *predecessor,NFRuleSet *ruleSet,
          RuleBasedNumberFormat *formatter,UnicodeString *description,UErrorCode *status)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  NumeratorSubstitution *this;
  NFRuleSet *_ruleSet;
  MultiplierSubstitution *this_00;
  int64_t iVar4;
  FractionalPartSubstitution *pFVar5;
  ModulusSubstitution *this_01;
  size_t size;
  FractionalPartSubstitution *local_148;
  ModulusSubstitution *local_138;
  FractionalPartSubstitution *local_128;
  FractionalPartSubstitution *local_118;
  MultiplierSubstitution *local_108;
  NumeratorSubstitution *local_d8;
  FractionalPartSubstitution *local_c8;
  UnicodeString *description_local;
  RuleBasedNumberFormat *formatter_local;
  NFRuleSet *ruleSet_local;
  NFRule *predecessor_local;
  NFRule *rule_local;
  FractionalPartSubstitution *pFStack_10;
  int32_t pos_local;
  
  iVar3 = UnicodeString::length(description);
  if (iVar3 == 0) {
    pFStack_10 = (FractionalPartSubstitution *)0x0;
  }
  else {
    size = 0;
    cVar2 = UnicodeString::charAt(description,0);
    if (cVar2 == L'<') {
      iVar4 = NFRule::getBaseValue(rule);
      if (iVar4 == -1) {
        *status = U_PARSE_ERROR;
        pFStack_10 = (FractionalPartSubstitution *)0x0;
      }
      else {
        iVar4 = NFRule::getBaseValue(rule);
        if (((iVar4 != -2) && (iVar4 = NFRule::getBaseValue(rule), iVar4 != -3)) &&
           (iVar4 = NFRule::getBaseValue(rule), iVar4 != -4)) {
          UVar1 = NFRuleSet::isFractionRuleSet(ruleSet);
          if (UVar1 != '\0') {
            this = (NumeratorSubstitution *)UMemory::operator_new((UMemory *)0x38,size);
            local_d8 = (NumeratorSubstitution *)0x0;
            if (this != (NumeratorSubstitution *)0x0) {
              iVar4 = NFRule::getBaseValue(rule);
              _ruleSet = RuleBasedNumberFormat::getDefaultRuleSet(formatter);
              NumeratorSubstitution::NumeratorSubstitution
                        (this,pos,(double)iVar4,_ruleSet,description,status);
              local_d8 = this;
            }
            return &local_d8->super_NFSubstitution;
          }
          this_00 = (MultiplierSubstitution *)UMemory::operator_new((UMemory *)0x28,size);
          local_108 = (MultiplierSubstitution *)0x0;
          if (this_00 != (MultiplierSubstitution *)0x0) {
            MultiplierSubstitution::MultiplierSubstitution
                      (this_00,pos,rule,ruleSet,description,status);
            local_108 = this_00;
          }
          return &local_108->super_NFSubstitution;
        }
        pFVar5 = (FractionalPartSubstitution *)UMemory::operator_new((UMemory *)0x20,size);
        local_c8 = (FractionalPartSubstitution *)0x0;
        if (pFVar5 != (FractionalPartSubstitution *)0x0) {
          IntegralPartSubstitution::IntegralPartSubstitution
                    ((IntegralPartSubstitution *)pFVar5,pos,ruleSet,description,status);
          local_c8 = pFVar5;
        }
        pFStack_10 = local_c8;
      }
    }
    else if (cVar2 == L'=') {
      pFVar5 = (FractionalPartSubstitution *)UMemory::operator_new((UMemory *)0x20,size);
      local_148 = (FractionalPartSubstitution *)0x0;
      if (pFVar5 != (FractionalPartSubstitution *)0x0) {
        SameValueSubstitution::SameValueSubstitution
                  ((SameValueSubstitution *)pFVar5,pos,ruleSet,description,status);
        local_148 = pFVar5;
      }
      pFStack_10 = local_148;
    }
    else if (cVar2 == L'>') {
      iVar4 = NFRule::getBaseValue(rule);
      if (iVar4 == -1) {
        pFVar5 = (FractionalPartSubstitution *)UMemory::operator_new((UMemory *)0x20,size);
        local_118 = (FractionalPartSubstitution *)0x0;
        if (pFVar5 != (FractionalPartSubstitution *)0x0) {
          AbsoluteValueSubstitution::AbsoluteValueSubstitution
                    ((AbsoluteValueSubstitution *)pFVar5,pos,ruleSet,description,status);
          local_118 = pFVar5;
        }
        pFStack_10 = local_118;
      }
      else {
        iVar4 = NFRule::getBaseValue(rule);
        if (((iVar4 != -2) && (iVar4 = NFRule::getBaseValue(rule), iVar4 != -3)) &&
           (iVar4 = NFRule::getBaseValue(rule), iVar4 != -4)) {
          UVar1 = NFRuleSet::isFractionRuleSet(ruleSet);
          if (UVar1 != '\0') {
            *status = U_PARSE_ERROR;
            return (NFSubstitution *)0x0;
          }
          this_01 = (ModulusSubstitution *)UMemory::operator_new((UMemory *)0x30,size);
          local_138 = (ModulusSubstitution *)0x0;
          if (this_01 != (ModulusSubstitution *)0x0) {
            ModulusSubstitution::ModulusSubstitution
                      (this_01,pos,rule,predecessor,ruleSet,description,status);
            local_138 = this_01;
          }
          return &local_138->super_NFSubstitution;
        }
        pFVar5 = (FractionalPartSubstitution *)UMemory::operator_new((UMemory *)0x28,size);
        local_128 = (FractionalPartSubstitution *)0x0;
        if (pFVar5 != (FractionalPartSubstitution *)0x0) {
          FractionalPartSubstitution::FractionalPartSubstitution
                    (pFVar5,pos,ruleSet,description,status);
          local_128 = pFVar5;
        }
        pFStack_10 = local_128;
      }
    }
    else {
      *status = U_PARSE_ERROR;
      pFStack_10 = (FractionalPartSubstitution *)0x0;
    }
  }
  return &pFStack_10->super_NFSubstitution;
}

Assistant:

NFSubstitution*
NFSubstitution::makeSubstitution(int32_t pos,
                                 const NFRule* rule,
                                 const NFRule* predecessor,
                                 const NFRuleSet* ruleSet,
                                 const RuleBasedNumberFormat* formatter,
                                 const UnicodeString& description,
                                 UErrorCode& status)
{
    // if the description is empty, return a NullSubstitution
    if (description.length() == 0) {
        return NULL;
    }

    switch (description.charAt(0)) {
        // if the description begins with '<'...
    case gLessThan:
        // throw an exception if the rule is a negative number
        // rule
        if (rule->getBaseValue() == NFRule::kNegativeNumberRule) {
            // throw new IllegalArgumentException("<< not allowed in negative-number rule");
            status = U_PARSE_ERROR;
            return NULL;
        }

        // if the rule is a fraction rule, return an
        // IntegralPartSubstitution
        else if (rule->getBaseValue() == NFRule::kImproperFractionRule
            || rule->getBaseValue() == NFRule::kProperFractionRule
            || rule->getBaseValue() == NFRule::kMasterRule) {
            return new IntegralPartSubstitution(pos, ruleSet, description, status);
        }

        // if the rule set containing the rule is a fraction
        // rule set, return a NumeratorSubstitution
        else if (ruleSet->isFractionRuleSet()) {
            return new NumeratorSubstitution(pos, (double)rule->getBaseValue(),
                formatter->getDefaultRuleSet(), description, status);
        }

        // otherwise, return a MultiplierSubstitution
        else {
            return new MultiplierSubstitution(pos, rule, ruleSet,
                description, status);
        }

        // if the description begins with '>'...
    case gGreaterThan:
        // if the rule is a negative-number rule, return
        // an AbsoluteValueSubstitution
        if (rule->getBaseValue() == NFRule::kNegativeNumberRule) {
            return new AbsoluteValueSubstitution(pos, ruleSet, description, status);
        }

        // if the rule is a fraction rule, return a
        // FractionalPartSubstitution
        else if (rule->getBaseValue() == NFRule::kImproperFractionRule
            || rule->getBaseValue() == NFRule::kProperFractionRule
            || rule->getBaseValue() == NFRule::kMasterRule) {
            return new FractionalPartSubstitution(pos, ruleSet, description, status);
        }

        // if the rule set owning the rule is a fraction rule set,
        // throw an exception
        else if (ruleSet->isFractionRuleSet()) {
            // throw new IllegalArgumentException(">> not allowed in fraction rule set");
            status = U_PARSE_ERROR;
            return NULL;
        }

        // otherwise, return a ModulusSubstitution
        else {
            return new ModulusSubstitution(pos, rule, predecessor,
                ruleSet, description, status);
        }

        // if the description begins with '=', always return a
        // SameValueSubstitution
    case gEquals:
        return new SameValueSubstitution(pos, ruleSet, description, status);

        // and if it's anything else, throw an exception
    default:
        // throw new IllegalArgumentException("Illegal substitution character");
        status = U_PARSE_ERROR;
    }
    return NULL;
}